

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  ushort uVar1;
  sqlite_int64 iValue;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  size_t sVar9;
  MatchinfoBuffer *pMVar10;
  u8 *__dest;
  Mem *pMVar11;
  LcsIterator *pLVar12;
  ulong uVar13;
  char *pBuf;
  uint uVar14;
  LcsIterator *pLVar15;
  char **ppOut;
  long lVar16;
  Fts3Cursor *pFVar17;
  long lVar18;
  Fts3Expr *pFVar19;
  Fts3Cursor *pFVar20;
  long lVar21;
  sqlite3_vtab *psVar22;
  byte *__s2;
  int iPhrase;
  char *a;
  int nPhrase;
  Fts3Cursor *pCsr;
  sqlite3_int64 nToken;
  int local_d8;
  undefined4 local_d4;
  Fts3Cursor *local_d0;
  undefined8 local_c8;
  Fts3Cursor *local_c0;
  undefined8 local_b8;
  sqlite3_vtab *local_b0;
  MatchInfo local_a8;
  LcsIterator *local_80;
  byte *local_78;
  sqlite3_stmt *local_70;
  _func_void_void_ptr *local_68;
  Fts3Table *local_60;
  sqlite3_context *local_58;
  char **local_50;
  u8 *local_48;
  Fts3Cursor *local_40;
  uint local_38 [2];
  
  iVar3 = fts3FunctionArg(pContext,"matchinfo",*apVal,&local_40);
  if (iVar3 != 0) {
    return;
  }
  if (nVal < 2) {
    pbVar7 = (byte *)0x0;
  }
  else {
    pbVar7 = (byte *)sqlite3ValueText(apVal[1],'\x01');
  }
  pFVar19 = local_40->pExpr;
  __s2 = (byte *)"pcx";
  if (pbVar7 != (byte *)0x0) {
    __s2 = pbVar7;
  }
  if (pFVar19 == (Fts3Expr *)0x0) {
    setResultStrOrError(pContext,"",0,'\0',(_func_void_void_ptr *)0x0);
    return;
  }
  psVar22 = (local_40->base).pVtab;
  local_a8.flag = '\0';
  local_a8._25_7_ = 0;
  local_a8.aMatchinfo = (u32 *)0x0;
  local_a8.nDoc = 0;
  local_a8.pCursor = local_40;
  local_a8.nCol = *(int *)&psVar22[2].pModule;
  local_a8.nPhrase = 0;
  pMVar10 = local_40->pMIBuffer;
  local_c0 = local_40;
  local_58 = pContext;
  if (pMVar10 == (MatchinfoBuffer *)0x0) {
LAB_001c6f72:
    lVar16 = 0;
    local_70 = (sqlite3_stmt *)((ulong)local_70 & 0xffffffff00000000);
    local_d0 = (Fts3Cursor *)((ulong)local_d0 & 0xffffffff00000000);
    fts3ExprIterate2(pFVar19,(int *)&local_d0,fts3ExprPhraseCountCb,&local_70);
    local_40->nPhrase = (uint)local_70;
    local_a8.nPhrase = (uint)local_70;
    bVar2 = *__s2;
    if (bVar2 != 0) {
      lVar16 = 0;
      pbVar7 = __s2;
      do {
        pbVar7 = pbVar7 + 1;
        local_d0 = (Fts3Cursor *)0x0;
        uVar14 = bVar2 - 0x62;
        if (0x17 < uVar14) {
LAB_001c6fdb:
          if (bVar2 == 0x61) {
LAB_001c6fe4:
            if (*(char *)((long)&psVar22[0x12].zErrMsg + 4) != '\0') goto LAB_001c7001;
          }
LAB_001c7192:
          sqlite3Fts3ErrMsg((char **)&local_d0,"unrecognized matchinfo request: %c");
          pFVar17 = local_d0;
          local_58->isError = 1;
          sqlite3VdbeMemSetStr
                    (local_58->pOut,(char *)local_d0,-1,'\x01',
                     (_func_void_void_ptr *)0xffffffffffffffff);
          sqlite3_free(pFVar17);
          goto LAB_001c78b8;
        }
        if ((0xc24003U >> (uVar14 & 0x1f) & 1) == 0) {
          if (uVar14 != 10) {
            if (uVar14 != 0xc) goto LAB_001c6fdb;
            goto LAB_001c6fe4;
          }
          if (*(char *)((long)&psVar22[0x12].zErrMsg + 6) == '\0') goto LAB_001c7192;
        }
LAB_001c7001:
        sVar8 = fts3MatchinfoSize(&local_a8,bVar2);
        lVar16 = lVar16 + sVar8;
        bVar2 = *pbVar7;
      } while (bVar2 != 0);
    }
    sVar9 = strlen((char *)__s2);
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      lVar18 = lVar16 * 8;
      pMVar10 = (MatchinfoBuffer *)sqlite3Malloc(lVar18 + 0x25 + sVar9);
      if (pMVar10 != (MatchinfoBuffer *)0x0) {
        local_d4 = 0;
        memset(pMVar10,0,lVar18 + 0x24);
        pMVar10->aMatchinfo[0] = 0x1c;
        pMVar10->aMatchinfo[lVar16 + 1] = (int)((lVar16 << 0x20) + 0x100000000U >> 0x1e) + 0x1c;
        pMVar10->nElem = (int)lVar16;
        pMVar10->zMatchinfo = (char *)(pMVar10[1].aRef + lVar18 + 4);
        memcpy(pMVar10[1].aRef + lVar18 + 4,__s2,sVar9 + 1);
        pMVar10->aRef[0] = '\x01';
        local_c0->pMIBuffer = pMVar10;
        local_c0->isMatchinfoNeeded = 1;
        pFVar17 = local_c0;
        goto LAB_001c711b;
      }
    }
    local_c0->pMIBuffer = (MatchinfoBuffer *)0x0;
    local_c0->isMatchinfoNeeded = 1;
LAB_001c7041:
    sqlite3_result_error_code(local_58,7);
  }
  else {
    iVar3 = strcmp(pMVar10->zMatchinfo,(char *)__s2);
    if (iVar3 != 0) {
      pMVar10->aRef[0] = '\0';
      if ((pMVar10->aRef[1] == '\0') && (pMVar10->aRef[2] == '\0')) {
        sqlite3_free(pMVar10);
      }
      local_40->pMIBuffer = (MatchinfoBuffer *)0x0;
      pFVar19 = local_40->pExpr;
      goto LAB_001c6f72;
    }
    local_d4 = 1;
    pFVar17 = local_40;
LAB_001c711b:
    if (pMVar10->aRef[1] == '\0') {
      pMVar10->aRef[1] = '\x01';
      __dest = &pMVar10->field_0x1c;
      local_68 = fts3MIBufferFree;
    }
    else if (pMVar10->aRef[2] == '\0') {
      pMVar10->aRef[2] = '\x01';
      __dest = pMVar10[1].aRef + (long)pMVar10->nElem * 4;
      local_68 = fts3MIBufferFree;
    }
    else {
      iVar3 = pMVar10->nElem;
      iVar4 = sqlite3_initialize();
      if ((iVar4 != 0) || (__dest = (u8 *)sqlite3Malloc((long)iVar3 << 2), __dest == (u8 *)0x0))
      goto LAB_001c7041;
      local_68 = sqlite3_free;
      if (pMVar10->bGlobal != 0) {
        memcpy(__dest,&pMVar10->field_0x1c,(long)pMVar10->nElem << 2);
      }
    }
    local_a8.nPhrase = pFVar17->nPhrase;
    local_60 = (Fts3Table *)(pFVar17->base).pVtab;
    local_70 = (sqlite3_stmt *)0x0;
    lVar16 = 0;
    local_b0 = psVar22;
    local_48 = __dest;
    do {
      bVar2 = __s2[lVar16];
      local_a8.aMatchinfo = (u32 *)__dest;
      if (bVar2 == 0) {
        iVar3 = 0;
        break;
      }
      local_a8.flag = bVar2;
      if (bVar2 < 0x6c) {
        if (bVar2 != 0x61) {
          if (bVar2 == 0x62) goto LAB_001c7355;
          uVar14 = local_a8.nCol;
          if (bVar2 == 99) goto joined_r0x001c7341;
          goto switchD_001c728d_caseD_6d;
        }
        if ((char)local_d4 != '\0') goto LAB_001c749a;
        local_78 = __s2;
        iVar3 = fts3MatchinfoSelectDoctotal
                          (local_60,&local_70,(sqlite3_int64 *)&local_d0,(char **)&local_b8);
        pFVar20 = local_d0;
        pFVar17 = local_c0;
        psVar22 = local_b0;
        __s2 = local_78;
        iVar4 = iVar3;
        if ((iVar3 == 0) && (0 < local_a8.nCol)) {
          lVar21 = (long)local_d0 / 2;
          lVar18 = 0;
          local_d8 = iVar3;
          do {
            iVar4 = sqlite3Fts3GetVarint(local_b8,(sqlite_int64 *)local_38);
            local_b8 = local_b8 + iVar4;
            *(int *)((long)local_a8.aMatchinfo + lVar18 * 4) =
                 (int)((long)((ulong)local_38[0] + lVar21) / (long)pFVar20);
            lVar18 = lVar18 + 1;
            pFVar17 = local_c0;
            psVar22 = local_b0;
            __s2 = local_78;
            iVar4 = local_d8;
          } while (lVar18 < local_a8.nCol);
        }
      }
      else {
        switch(bVar2) {
        case 0x6c:
          iValue = pFVar17->iPrevId;
          local_d0 = (Fts3Cursor *)0x0;
          iVar3 = fts3SqlStmt(local_60,0x15,(sqlite3_stmt **)&local_d0,(sqlite3_value **)0x0);
          pFVar20 = local_d0;
          if (iVar3 == 0) {
            sqlite3_bind_int64((sqlite3_stmt *)local_d0,1,iValue);
            iVar3 = sqlite3_step((sqlite3_stmt *)pFVar20);
            if (iVar3 == 100) {
              pMVar11 = columnMem((sqlite3_stmt *)pFVar20,0);
              uVar1 = pMVar11->flags;
              columnMallocFailure((sqlite3_stmt *)pFVar20);
              pFVar17 = local_c0;
              if ((uVar1 & 0xf) == 0) {
                local_d8 = 0;
                pMVar11 = columnMem((sqlite3_stmt *)pFVar20,0);
                pBuf = (char *)sqlite3_value_blob(pMVar11);
                columnMallocFailure((sqlite3_stmt *)pFVar20);
                iVar3 = local_d8;
                if (0 < local_a8.nCol) {
                  lVar18 = 0;
                  do {
                    iVar3 = sqlite3Fts3GetVarint(pBuf,(sqlite_int64 *)&local_d0);
                    pBuf = pBuf + iVar3;
                    *(int *)((long)local_a8.aMatchinfo + lVar18 * 4) = (int)local_d0;
                    lVar18 = lVar18 + 1;
                    pFVar17 = local_c0;
                    psVar22 = local_b0;
                    iVar3 = local_d8;
                  } while (lVar18 < local_a8.nCol);
                }
                goto LAB_001c7315;
              }
            }
            iVar3 = sqlite3_reset((sqlite3_stmt *)pFVar20);
            if (iVar3 == 0) {
              iVar3 = 0x10b;
            }
            pFVar20 = (Fts3Cursor *)0x0;
          }
LAB_001c7315:
          local_d8 = iVar3;
          sqlite3_reset((sqlite3_stmt *)pFVar20);
          iVar3 = local_d8;
          iVar4 = local_d8;
          break;
        case 0x6d:
        case 0x6f:
        case 0x71:
        case 0x72:
switchD_001c728d_caseD_6d:
          pFVar19 = pFVar17->pExpr;
          local_c8 = 0;
          local_b8 = (char *)((ulong)local_b8._4_4_ << 0x20);
          local_d0 = pFVar17;
          iVar3 = fts3ExprIterate2(pFVar19,(int *)&local_b8,fts3ExprLoadDoclistsCb,&local_d0);
          iVar4 = iVar3;
          if (iVar3 == 0) {
            local_d8 = iVar3;
            if ((char)local_d4 != '\0') {
LAB_001c73d3:
              local_d0 = (Fts3Cursor *)((ulong)local_d0 & 0xffffffff00000000);
              fts3ExprIterate2(pFVar19,(int *)&local_d0,fts3ExprLocalHitsCb,&local_a8);
              goto LAB_001c749a;
            }
            local_d8 = 0;
            if ((pFVar17->pDeferred == (Fts3DeferredToken *)0x0) ||
               (local_d8 = iVar3,
               iVar3 = fts3MatchinfoSelectDoctotal(local_60,&local_70,&local_a8.nDoc,(char **)0x0),
               iVar4 = iVar3, local_d8 = iVar3, iVar3 == 0)) {
              local_d0 = (Fts3Cursor *)((ulong)local_d0 & 0xffffffff00000000);
              local_d8 = fts3ExprIterate2(pFVar19,(int *)&local_d0,fts3ExprGlobalHitsCb,&local_a8);
              sqlite3Fts3EvalTestDeferred(pFVar17,&local_d8);
              iVar3 = local_d8;
              iVar4 = local_d8;
              if (local_d8 == 0) goto LAB_001c73d3;
            }
          }
          break;
        case 0x6e:
          if ((char)local_d4 == '\0') {
            local_d0 = (Fts3Cursor *)0x0;
            iVar3 = fts3MatchinfoSelectDoctotal
                              (local_60,&local_70,(sqlite3_int64 *)&local_d0,(char **)0x0);
            *local_a8.aMatchinfo = (int)local_d0;
            iVar4 = iVar3;
          }
          else {
LAB_001c749a:
            iVar3 = 0;
            iVar4 = local_d8;
          }
          break;
        case 0x70:
          uVar14 = local_a8.nPhrase;
joined_r0x001c7341:
          iVar3 = 0;
          iVar4 = local_d8;
          if ((char)local_d4 == '\0') {
            *(uint *)__dest = uVar14;
            iVar3 = 0;
          }
          break;
        case 0x73:
          local_c8 = 0;
          local_b8 = (char *)((ulong)local_b8._4_4_ << 0x20);
          local_d0 = pFVar17;
          iVar3 = fts3ExprIterate2(pFVar17->pExpr,(int *)&local_b8,fts3ExprLoadDoclistsCb,&local_d0)
          ;
          iVar4 = iVar3;
          if (iVar3 == 0) {
            iVar6 = pFVar17->nPhrase;
            local_d8 = iVar3;
            iVar5 = sqlite3_initialize();
            iVar3 = 7;
            iVar4 = iVar3;
            if ((iVar5 == 0) &&
               (pLVar12 = (LcsIterator *)sqlite3Malloc((long)iVar6 << 5),
               pLVar12 != (LcsIterator *)0x0)) {
              memset(pLVar12,0,(long)pFVar17->nPhrase << 5);
              local_d0 = (Fts3Cursor *)((ulong)local_d0 & 0xffffffff00000000);
              fts3ExprIterate2(pFVar17->pExpr,(int *)&local_d0,fts3MatchinfoLcsCb,pLVar12);
              if (0 < (long)local_a8.nPhrase) {
                lVar18 = 0;
                iVar3 = 0;
                do {
                  iVar3 = iVar3 - *(int *)(*(long *)(*(long *)((long)&pLVar12->pExpr + lVar18) +
                                                    0x20) + 0x50);
                  *(int *)((long)&pLVar12->iPosOffset + lVar18) = iVar3;
                  lVar18 = lVar18 + 0x20;
                } while ((long)local_a8.nPhrase * 0x20 != lVar18);
              }
              if (local_a8.nCol < 1) {
                iVar3 = 0;
              }
              else {
                ppOut = &pLVar12->pRead;
                local_78 = (byte *)0x0;
                local_80 = pLVar12;
                local_50 = ppOut;
                do {
                  iVar3 = 0;
                  if (0 < local_a8.nPhrase) {
                    lVar18 = 0;
                    iVar4 = 0;
                    do {
                      iVar3 = sqlite3Fts3EvalPhrasePoslist
                                        (local_c0,((LcsIterator *)(ppOut + -2))->pExpr,(int)local_78
                                         ,ppOut);
                      pLVar12 = local_80;
                      psVar22 = local_b0;
                      if (iVar3 != 0) goto LAB_001c7800;
                      if (*ppOut != (char *)0x0) {
                        *(int *)(ppOut + 1) = *(int *)(ppOut + -1);
                        fts3LcsIteratorAdvance((LcsIterator *)(ppOut + -2));
                        if (*ppOut == (char *)0x0) {
                          pLVar12 = local_80;
                          psVar22 = local_b0;
                          iVar3 = 0x10b;
                          goto LAB_001c7800;
                        }
                        iVar4 = iVar4 + 1;
                      }
                      psVar22 = local_b0;
                      lVar18 = lVar18 + 1;
                      uVar13 = (ulong)local_a8.nPhrase;
                      ppOut = ppOut + 4;
                    } while (lVar18 < (long)uVar13);
                    iVar3 = 0;
                    ppOut = local_50;
                    pLVar12 = local_80;
                    if (0 < iVar4) {
                      while( true ) {
                        if ((int)uVar13 < 1) {
                          pLVar12 = (LcsIterator *)0x0;
                        }
                        else {
                          uVar13 = uVar13 & 0xffffffff;
                          iVar6 = 0;
                          pLVar12 = (LcsIterator *)0x0;
                          pLVar15 = local_80;
                          do {
                            if (pLVar15->pRead == (char *)0x0) {
                              iVar6 = 0;
                            }
                            else {
                              if ((pLVar12 == (LcsIterator *)0x0) || (pLVar15->iPos < pLVar12->iPos)
                                 ) {
                                pLVar12 = pLVar15;
                              }
                              if ((iVar6 == 0) || (iVar5 = 1, pLVar15->iPos == pLVar15[-1].iPos)) {
                                iVar5 = iVar6 + 1;
                              }
                              iVar6 = iVar5;
                              if (iVar3 < iVar6) {
                                iVar3 = iVar6;
                              }
                            }
                            pLVar15 = pLVar15 + 1;
                            uVar13 = uVar13 - 1;
                          } while (uVar13 != 0);
                        }
                        iVar6 = fts3LcsIteratorAdvance(pLVar12);
                        ppOut = local_50;
                        pLVar12 = local_80;
                        if (iVar4 - iVar6 == 0 || iVar4 < iVar6) break;
                        uVar13 = (ulong)(uint)local_a8.nPhrase;
                        iVar4 = iVar4 - iVar6;
                      }
                    }
                  }
                  *(int *)((long)local_a8.aMatchinfo + (long)local_78 * 4) = iVar3;
                  local_78 = local_78 + 1;
                  iVar3 = 0;
                } while ((long)local_78 < (long)local_a8.nCol);
              }
LAB_001c7800:
              sqlite3_free(pLVar12);
              pFVar17 = local_c0;
              iVar4 = iVar3;
            }
          }
          break;
        default:
          if (bVar2 != 0x79) goto switchD_001c728d_caseD_6d;
LAB_001c7355:
          sVar8 = fts3MatchinfoSize(&local_a8,bVar2);
          memset(__dest,0,sVar8 * 4);
          iVar3 = fts3ExprLHitGather(pFVar17->pExpr,&local_a8);
          iVar4 = iVar3;
        }
      }
      local_d8 = iVar4;
      sVar8 = fts3MatchinfoSize(&local_a8,__s2[lVar16]);
      __dest = (u8 *)((long)local_a8.aMatchinfo + sVar8 * 4);
      lVar16 = lVar16 + 1;
      local_a8.aMatchinfo = (u32 *)__dest;
    } while (iVar3 == 0);
    sqlite3_reset(local_70);
    if ((char)local_d4 == '\0') {
      pMVar10 = pFVar17->pMIBuffer;
      pMVar10->bGlobal = 1;
      memcpy(pMVar10[1].aRef + (long)pMVar10->nElem * 4,&pMVar10->field_0x1c,
             (long)pMVar10->nElem << 2);
    }
    if (iVar3 == 0) {
      setResultStrOrError(local_58,(char *)local_48,pFVar17->pMIBuffer->nElem << 2,'\0',local_68);
    }
    else {
      sqlite3_result_error_code(local_58,iVar3);
      (*local_68)(local_48);
    }
  }
LAB_001c78b8:
  sqlite3_blob_close((sqlite3_blob *)psVar22[0x13].zErrMsg);
  psVar22[0x13].zErrMsg = (char *)0x0;
  return;
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}